

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::getPtr<wasm::SIMDLoad>
          (Replacer *this,SIMDLoad *curr,Index bytes)

{
  Builder *this_00;
  Index index;
  Block *value;
  LocalSet *pLVar1;
  Expression *pEVar2;
  LocalSet *local_60;
  Expression *local_58;
  LocalGet *local_50;
  initializer_list<wasm::Expression_*> local_48;
  Index local_34;
  
  value = (Block *)addOffsetGlobal(this,curr->ptr,(Name)(curr->memory).super_IString.str);
  if (this->parent->checkBounds == true) {
    index = Builder::addVar((this->
                            super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                            ).
                            super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .
                            super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .currFunction,(Type)(this->parent->pointerType).id);
    this_00 = &this->builder;
    local_34 = bytes;
    pLVar1 = Builder::makeLocalSet(this_00,index,(Expression *)value);
    pEVar2 = makePtrBoundsCheck<wasm::SIMDLoad>(this,curr,index,local_34);
    local_50 = Builder::makeLocalGet(this_00,index,(Type)(this->parent->pointerType).id);
    local_48._M_array = (iterator)&local_60;
    local_48._M_len = 3;
    local_60 = pLVar1;
    local_58 = pEVar2;
    value = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>(this_00,&local_48);
  }
  return (Expression *)value;
}

Assistant:

Expression* getPtr(T* curr, Index bytes) {
      Expression* ptrValue = addOffsetGlobal(curr->ptr, curr->memory);
      if (parent.checkBounds) {
        Index ptrIdx = Builder::addVar(getFunction(), parent.pointerType);
        Expression* ptrSet = builder.makeLocalSet(ptrIdx, ptrValue);
        Expression* boundsCheck = makePtrBoundsCheck(curr, ptrIdx, bytes);
        Expression* ptrGet = builder.makeLocalGet(ptrIdx, parent.pointerType);
        return builder.makeBlock({ptrSet, boundsCheck, ptrGet});
      }

      return ptrValue;
    }